

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::delete_node(hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
              *this,index_pointer node,uint shifts)

{
  bool bVar1;
  linear_node *this_00;
  uint shifts_local;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_local;
  index_pointer node_local;
  
  this_local = (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)node;
  bVar1 = details::index_pointer::is_heap((index_pointer *)&this_local);
  if (bVar1) {
    bVar1 = details::index_pointer::is_leaf((index_pointer *)&this_local);
    if (bVar1) {
      assert_failed("!node.is_leaf ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x315);
    }
    bVar1 = details::depth_is_internal_node(shifts);
    if ((!bVar1) &&
       (this_00 = details::index_pointer::untag<pstore::index::details::linear_node*,void>
                            ((index_pointer *)&this_local), this_00 != (linear_node *)0x0)) {
      details::linear_node::operator_delete(this_00,node.internal_);
    }
  }
  return;
}

Assistant:

void hamt_map<KeyType, ValueType, Hash, KeyEqual>::delete_node (index_pointer const node,
                                                                        unsigned const shifts) {
            if (node.is_heap ()) {
                PSTORE_ASSERT (!node.is_leaf ());
                if (details::depth_is_internal_node (shifts)) {
                    // Internal nodes are owned by internals_container_. Don't delete them here. If
                    // this ever changes, then add something like: delete
                    // node.untag<internal_node *> ();
                } else {
                    delete node.untag<linear_node *> ();
                }
            }
        }